

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpcommon_node.c
# Opt level: O1

void JPCommonNode_copy(JPCommonNode *node1,JPCommonNode *node2)

{
  int iVar1;
  
  JPCommonNode_set_pron(node1,node2->pron);
  JPCommonNode_set_pos(node1,node2->pos);
  JPCommonNode_set_ctype(node1,node2->ctype);
  JPCommonNode_set_cform(node1,node2->cform);
  iVar1 = node2->chain_flag;
  node1->acc = node2->acc;
  node1->chain_flag = iVar1;
  return;
}

Assistant:

void JPCommonNode_copy(JPCommonNode * node1, JPCommonNode * node2)
{
   JPCommonNode_set_pron(node1, node2->pron);
   JPCommonNode_set_pos(node1, node2->pos);
   JPCommonNode_set_ctype(node1, node2->ctype);
   JPCommonNode_set_cform(node1, node2->cform);
   JPCommonNode_set_acc(node1, node2->acc);
   JPCommonNode_set_chain_flag(node1, node2->chain_flag);
}